

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O2

Vector<int,_3,_true> __thiscall
Nova::Vector<int,_4,_true>::Remove_Index(Vector<int,_4,_true> *this,int index)

{
  int iVar1;
  int *piVar2;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  int i;
  uint i_00;
  undefined4 in_register_00000034;
  int iVar4;
  Vector<int,_3,_true> VVar5;
  
  if (in_EDX < 4) {
    Vector<int,_3,_true>::Vector((Vector<int,_3,_true> *)this);
    uVar3 = extraout_RDX;
    for (i_00 = 0; in_EDX != i_00; i_00 = i_00 + 1) {
      piVar2 = operator[]((Vector<int,_4,_true> *)CONCAT44(in_register_00000034,index),i_00);
      iVar4 = *piVar2;
      piVar2 = Vector<int,_3,_true>::operator[]((Vector<int,_3,_true> *)this,i_00);
      *piVar2 = iVar4;
      uVar3 = extraout_RDX_00;
    }
    iVar4 = in_EDX - 3;
    for (; iVar4 != 0; iVar4 = iVar4 + 1) {
      piVar2 = operator[]((Vector<int,_4,_true> *)CONCAT44(in_register_00000034,index),in_EDX + 1);
      iVar1 = *piVar2;
      piVar2 = Vector<int,_3,_true>::operator[]((Vector<int,_3,_true> *)this,in_EDX);
      *piVar2 = iVar1;
      uVar3 = extraout_RDX_01;
      in_EDX = in_EDX + 1;
    }
    VVar5._data._M_elems[2] = (int)uVar3;
    VVar5._data._M_elems._0_8_ = this;
    return (Vector<int,_3,_true>)VVar5._data._M_elems;
  }
  __assert_fail("index>=0 && index<d",
                "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Geometry/../Tools/include/nova/Tools/Vectors/Vector.h"
                ,0x1d2,
                "Vector<T, d - 1> Nova::Vector<int, 4>::Remove_Index(const int) const [T = int, d = 4, order_ascending = true]"
               );
}

Assistant:

Vector<T,d-1> Remove_Index(const int index) const
    {
        assert(index>=0 && index<d);
        Vector<T,d-1> ret;
        for(int i=0;i<index;++i) ret[i]=(*this)[i];
        for(int i=index+1;i<d;++i) ret[i-1]=(*this)[i];
        return ret;
    }